

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::UVMapping2D::ToString_abi_cxx11_(string *__return_storage_ptr__,UVMapping2D *this)

{
  float *unaff_RBX;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ UVMapping2D su: %f sv: %f du: %f dv: %f ]",
             (char *)this,&this->sv,&this->du,&this->dv,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string UVMapping2D::ToString() const {
    return StringPrintf("[ UVMapping2D su: %f sv: %f du: %f dv: %f ]", su, sv, du, dv);
}